

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OctreeTracer.cpp
# Opt level: O2

void __thiscall OctreeTracer::Resize(OctreeTracer *this,uint32_t width,uint32_t height)

{
  shared_ptr<myvk::ImageView> *this_00;
  element_type *peVar1;
  Ptr<Device> *device;
  uint32_t uVar2;
  uint32_t uVar3;
  pointer this_01;
  VkExtent2D local_70;
  _func_int **local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_60;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_58;
  element_type *local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  
  this->m_width = width;
  this->m_height = height;
  uVar3 = (width + 7 >> 3) + 1;
  uVar2 = (height + 7 >> 3) + 1;
  this_01 = (this->m_frame_resources).
            super__Vector_base<OctreeTracer::FrameResource,_std::allocator<OctreeTracer::FrameResource>_>
            ._M_impl.super__Vector_impl_data._M_start;
  peVar1 = (this_01->m_beam_image).super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  if (((peVar1->super_ImageBase).m_extent.width != uVar3) ||
     ((peVar1->super_ImageBase).m_extent.height != uVar2)) {
    local_48._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         (this->m_frame_resources).
         super__Vector_base<OctreeTracer::FrameResource,_std::allocator<OctreeTracer::FrameResource>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_50 = (element_type *)&this->m_beam_render_pass;
    for (; this_01 != (pointer)local_48._M_pi; this_01 = this_01 + 1) {
      device = (Ptr<Device> *)
               (**(code **)((long)(((this_01->m_beam_image).
                                    super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr)->super_ImageBase).super_DeviceObjectBase.super_Base.
                                  _vptr_Base + 0x10))();
      local_68 = (_func_int **)0x0;
      _Stack_60._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_58._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_70.width = uVar3;
      local_70.height = uVar2;
      myvk::Image::CreateTexture2D
                ((Image *)&stack0xffffffffffffffc0,device,&local_70,1,VK_FORMAT_R32_SFLOAT,0x14,
                 (vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>
                  *)&local_68);
      std::__shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2> *)this_01,
                 (__shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc8);
      std::vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>::
      ~vector((vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>
               *)&local_68);
      std::__shared_ptr<myvk::ImageBase,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<myvk::Image,void>
                ((__shared_ptr<myvk::ImageBase,(__gnu_cxx::_Lock_policy)2> *)
                 &stack0xffffffffffffffc0,
                 (__shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2> *)this_01);
      myvk::ImageView::Create
                ((ImageView *)&local_68,(Ptr<ImageBase> *)&stack0xffffffffffffffc0,
                 VK_IMAGE_VIEW_TYPE_2D,1);
      this_00 = &this_01->m_beam_image_view;
      std::__shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&this_00->super___shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<myvk::ImageView,_(__gnu_cxx::_Lock_policy)2> *)&local_68);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_60);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc8);
      myvk::Framebuffer::Create((Framebuffer *)&local_68,(Ptr<RenderPass> *)local_50,this_00);
      std::__shared_ptr<myvk::Framebuffer,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&(this_01->m_beam_framebuffer).
                  super___shared_ptr<myvk::Framebuffer,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<myvk::Framebuffer,_(__gnu_cxx::_Lock_policy)2> *)&local_68);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_60);
      myvk::DescriptorSet::UpdateCombinedImageSampler
                ((this_01->m_descriptor_set).
                 super___shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 &this_01->m_beam_sampler,this_00,0,0);
    }
  }
  return;
}

Assistant:

void OctreeTracer::Resize(uint32_t width, uint32_t height) {
	m_width = width;
	m_height = height;

	uint32_t beam_width = get_beam_size(m_width), beam_height = get_beam_size(m_height);
	if (m_frame_resources[0].m_beam_image->GetExtent().width != beam_width ||
	    m_frame_resources[0].m_beam_image->GetExtent().height != beam_height) {
		for (auto &i : m_frame_resources) {
			i.m_beam_image = myvk::Image::CreateTexture2D(
			    i.m_beam_image->GetDevicePtr(), {beam_width, beam_height}, 1, VK_FORMAT_R32_SFLOAT,
			    VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT | VK_IMAGE_USAGE_SAMPLED_BIT);
			i.m_beam_image_view = myvk::ImageView::Create(i.m_beam_image, VK_IMAGE_VIEW_TYPE_2D);
			i.m_beam_framebuffer = myvk::Framebuffer::Create(m_beam_render_pass, i.m_beam_image_view);
			i.m_descriptor_set->UpdateCombinedImageSampler(i.m_beam_sampler, i.m_beam_image_view, 0);
		}
	}
}